

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteStates::MADPComponentDiscreteStates
          (MADPComponentDiscreteStates *this,size_t nrS)

{
  this->_vptr_MADPComponentDiscreteStates = (_func_int **)&PTR__MADPComponentDiscreteStates_005da218
  ;
  this->_m_initialized = false;
  this->_m_nrStates = nrS;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_initialStateDistribution = (StateDistributionVector *)0x0;
  SetNrStates(this,nrS);
  this->_m_initialized = true;
  return;
}

Assistant:

MADPComponentDiscreteStates::MADPComponentDiscreteStates(size_t nrS) 
    :
        _m_initialized(false)
        ,_m_nrStates(nrS)
        ,_m_initialStateDistribution(0)
{
    SetNrStates(nrS);
    _m_initialized = true;
}